

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void multi_done_locked(connectdata *conn,Curl_easy *data,void *userdata)

{
  byte bVar1;
  curl_off_t cVar2;
  ulong uVar3;
  ConnectBits CVar4;
  _Bool _Var5;
  uint uVar6;
  char *local_78;
  char *local_70;
  char *local_68;
  char *host;
  multi_done_ctx *mdctx;
  void *userdata_local;
  Curl_easy *data_local;
  connectdata *conn_local;
  
  Curl_detach_connection(data);
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     (0 < Curl_trc_feat_multi.log_level)) {
    uVar6 = Curl_uint_spbset_count(&conn->xfers_attached);
    Curl_trc_multi(data,"multi_done_locked, in use=%u",(ulong)uVar6);
  }
  _Var5 = Curl_uint_spbset_empty(&conn->xfers_attached);
  if (_Var5) {
    *(uint *)&(data->state).field_0x7be = *(uint *)&(data->state).field_0x7be & 0xffffefff | 0x1000;
    (data->state).recent_conn_id = conn->connection_id;
    if (conn->dns_entry != (Curl_dns_entry *)0x0) {
      Curl_resolv_unlink(data,&conn->dns_entry);
    }
    Curl_dnscache_prune(data);
    if ((((((*(ulong *)&(data->set).field_0x89c >> 0x1f & 1) == 0) ||
          (conn->http_ntlm_state == NTLMSTATE_TYPE2)) || (conn->proxy_ntlm_state == NTLMSTATE_TYPE2)
         ) && (((ulong)conn->bits >> 5 & 1) == 0)) &&
       (((*userdata & 1) == 0 || (_Var5 = Curl_conn_is_multiplex(conn,0), _Var5)))) {
      _Var5 = Curl_cpool_conn_now_idle(data,conn);
      if (_Var5) {
        if (((ulong)conn->bits >> 1 & 1) == 0) {
          if (((ulong)conn->bits & 1) == 0) {
            if (((ulong)conn->bits >> 8 & 1) == 0) {
              local_78 = (conn->host).dispname;
            }
            else {
              local_78 = (conn->conn_to_host).dispname;
            }
            local_70 = local_78;
          }
          else {
            local_70 = (conn->http_proxy).host.dispname;
          }
          local_68 = local_70;
        }
        else {
          local_68 = (conn->socks_proxy).host.dispname;
        }
        (data->state).lastconnect_id = conn->connection_id;
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,"Connection #%ld to host %s left intact",conn->connection_id,local_68);
        }
      }
      else {
        (data->state).lastconnect_id = -1;
      }
    }
    else {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
          (0 < Curl_trc_feat_multi.log_level)))) {
        cVar2 = conn->connection_id;
        uVar3 = *(ulong *)&(data->set).field_0x89c;
        CVar4 = conn->bits;
        bVar1 = *userdata;
        _Var5 = Curl_conn_is_multiplex(conn,0);
        Curl_trc_multi(data,
                       "multi_done, not reusing connection=%ld, forbid=%d, close=%d, premature=%d, conn_multiplex=%d"
                       ,cVar2,(ulong)((uint)(uVar3 >> 0x1f) & 1),
                       (ulong)((uint)((ulong)CVar4 >> 5) & 1),(ulong)(bVar1 & 1),(uint)_Var5);
      }
      Curl_conncontrol(conn,1);
      Curl_conn_terminate(data,conn,(*userdata & 1) != 0);
    }
  }
  else if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
          && ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              && (0 < Curl_trc_feat_multi.log_level)))) {
    uVar6 = Curl_uint_spbset_count(&conn->xfers_attached);
    Curl_trc_multi(data,"Connection still in use %u, no more multi_done now!",(ulong)uVar6);
  }
  return;
}

Assistant:

static void multi_done_locked(struct connectdata *conn,
                              struct Curl_easy *data,
                              void *userdata)
{
  struct multi_done_ctx *mdctx = userdata;

  Curl_detach_connection(data);

  CURL_TRC_M(data, "multi_done_locked, in use=%u",
             Curl_uint_spbset_count(&conn->xfers_attached));
  if(CONN_INUSE(conn)) {
    /* Stop if still used. */
    CURL_TRC_M(data, "Connection still in use %u, no more multi_done now!",
               Curl_uint_spbset_count(&conn->xfers_attached));
    return;
  }

  data->state.done = TRUE; /* called just now! */
  data->state.recent_conn_id = conn->connection_id;

  if(conn->dns_entry)
    Curl_resolv_unlink(data, &conn->dns_entry); /* done with this */
  Curl_dnscache_prune(data);

  /* if data->set.reuse_forbid is TRUE, it means the libcurl client has
     forced us to close this connection. This is ignored for requests taking
     place in a NTLM/NEGOTIATE authentication handshake

     if conn->bits.close is TRUE, it means that the connection should be
     closed in spite of all our efforts to be nice, due to protocol
     restrictions in our or the server's end

     if premature is TRUE, it means this connection was said to be DONE before
     the entire request operation is complete and thus we cannot know in what
     state it is for reusing, so we are forced to close it. In a perfect world
     we can add code that keep track of if we really must close it here or not,
     but currently we have no such detail knowledge.
  */

  if((data->set.reuse_forbid
#if defined(USE_NTLM)
      && !(conn->http_ntlm_state == NTLMSTATE_TYPE2 ||
           conn->proxy_ntlm_state == NTLMSTATE_TYPE2)
#endif
#if defined(USE_SPNEGO)
      && !(conn->http_negotiate_state == GSS_AUTHRECV ||
           conn->proxy_negotiate_state == GSS_AUTHRECV)
#endif
     ) || conn->bits.close
       || (mdctx->premature && !Curl_conn_is_multiplex(conn, FIRSTSOCKET))) {
    CURL_TRC_M(data, "multi_done, not reusing connection=%"
                     FMT_OFF_T ", forbid=%d"
                     ", close=%d, premature=%d, conn_multiplex=%d",
                     conn->connection_id, data->set.reuse_forbid,
                     conn->bits.close, mdctx->premature,
                     Curl_conn_is_multiplex(conn, FIRSTSOCKET));
    connclose(conn, "disconnecting");
    Curl_conn_terminate(data, conn, mdctx->premature);
  }
  else {
    /* the connection is no longer in use by any transfer */
    if(Curl_cpool_conn_now_idle(data, conn)) {
      /* connection kept in the cpool */
      const char *host =
#ifndef CURL_DISABLE_PROXY
        conn->bits.socksproxy ?
        conn->socks_proxy.host.dispname :
        conn->bits.httpproxy ? conn->http_proxy.host.dispname :
#endif
        conn->bits.conn_to_host ? conn->conn_to_host.dispname :
        conn->host.dispname;
      data->state.lastconnect_id = conn->connection_id;
      infof(data, "Connection #%" FMT_OFF_T " to host %s left intact",
            conn->connection_id, host);
    }
    else {
      /* connection was removed from the cpool and destroyed. */
      data->state.lastconnect_id = -1;
    }
  }
}